

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::MILSpec::Value_BlobFileValue::ByteSizeLong(Value_BlobFileValue *this)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  
  lVar1 = *(long *)(((ulong)(this->filename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar1 == 0) {
    sVar3 = 0;
  }
  else {
    uVar4 = (uint)lVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->offset_ != 0) {
    uVar5 = this->offset_ | 1;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar1 * 9 + 0x89U >> 6);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar5 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }